

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  exr_coding_channel_info_t *peVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  long lVar21;
  void *pvVar22;
  ushort uVar23;
  int32_t *piVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  float *pfVar29;
  bool bVar30;
  long local_68;
  
  iVar3 = (decode->chunk).height;
  iVar4 = decode->user_line_end_ignore;
  if (iVar4 < iVar3) {
    uVar5 = (decode->chunk).width;
    iVar6 = decode->user_line_begin_skip;
    pvVar22 = decode->unpacked_buffer;
    piVar24 = decode->sample_count_table;
    local_68 = 0;
    iVar15 = 0;
    do {
      uVar13 = (ulong)decode->channel_count;
      bVar17 = 0 < (long)uVar13;
      if (0 < (long)uVar13) {
        peVar7 = decode->channels;
        uVar27 = 0;
        do {
          bVar8 = iVar15 < iVar6;
          uVar28 = uVar27 + 1;
          bVar30 = uVar28 != (uVar13 & 0xffffffff);
          cVar1 = peVar7[uVar27].bytes_per_element;
          if (peVar7[uVar27].field_12.decode_to_ptr == (uint8_t *)0x0) {
            if ((decode->decode_flags & 1) == 0) {
              iVar12 = piVar24[(long)(int)uVar5 + -1];
            }
            else if ((int)uVar5 < 1) {
              iVar12 = 0;
            }
            else {
              uVar13 = 0;
              iVar12 = 0;
              do {
                iVar12 = iVar12 + piVar24[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar5 != uVar13);
            }
            lVar16 = (long)iVar12;
            pvVar22 = (void *)((long)pvVar22 + cVar1 * lVar16);
            if (bVar30 || bVar8) {
              lVar16 = 0;
            }
            local_68 = local_68 + lVar16;
            iVar12 = 7;
          }
          else if ((int)uVar5 < 1) {
            iVar12 = 0;
          }
          else {
            lVar16 = (long)peVar7[uVar27].user_bytes_per_element;
            pfVar29 = (float *)(peVar7[uVar27].field_12.decode_to_ptr + local_68 * lVar16);
            uVar13 = 0;
            iVar12 = 0;
            do {
              iVar26 = iVar12;
              iVar14 = piVar24[uVar13];
              if ((decode->decode_flags & 1) != 0) {
                iVar26 = 0;
                iVar14 = iVar12;
              }
              iVar12 = iVar14;
              iVar26 = piVar24[uVar13] - iVar26;
              uVar2 = peVar7[uVar27].data_type;
              if (uVar2 == 0) {
                uVar2 = peVar7[uVar27].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar26) {
                    lVar21 = 0;
                    do {
                      *pfVar29 = (float)*(uint *)((long)pvVar22 + lVar21 * 4);
                      pfVar29 = (float *)((long)pfVar29 + lVar16);
                      lVar21 = lVar21 + 1;
                    } while (iVar26 != (int)lVar21);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar26) {
                    lVar21 = 0;
                    do {
                      uVar11 = *(uint *)((long)pvVar22 + lVar21 * 4);
                      uVar23 = 0x7c00;
                      if (uVar11 < 0xffe1) {
                        fVar19 = (float)(int)uVar11;
                        if ((uint)fVar19 < 0x38800000) {
                          if ((uint)fVar19 < 0x33000001) {
                            uVar23 = 0;
                          }
                          else {
                            cVar9 = (char)((uint)fVar19 >> 0x17);
                            uVar11 = (uint)fVar19 & 0x7fffff | 0x800000;
                            uVar23 = (ushort)(uVar11 >> (0x7eU - cVar9 & 0x1f));
                            if (0x80000000 < uVar11 << (cVar9 + 0xa2U & 0x1f)) {
                              uVar23 = uVar23 + 1;
                            }
                          }
                        }
                        else if ((uint)fVar19 < 0x7f800000) {
                          if ((uint)fVar19 < 0x477ff000) {
                            uVar23 = (ushort)((int)fVar19 + 0x8000fff +
                                              (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else if (fVar19 != INFINITY) {
                          uVar11 = (uint)fVar19 >> 0xd & 0x3ff;
                          uVar23 = (ushort)(uVar11 == 0) | (ushort)uVar11 | 0x7c00;
                        }
                      }
                      *(ushort *)pfVar29 = uVar23;
                      pfVar29 = (float *)((long)pfVar29 + lVar16);
                      lVar21 = lVar21 + 1;
                    } while (iVar26 != (int)lVar21);
                  }
                }
                else {
                  if (uVar2 != 0) goto LAB_001316fb;
                  if (0 < iVar26) {
                    lVar21 = 0;
                    do {
                      *pfVar29 = *(float *)((long)pvVar22 + lVar21 * 4);
                      pfVar29 = (float *)((long)pfVar29 + lVar16);
                      lVar21 = lVar21 + 1;
                    } while (iVar26 != (int)lVar21);
                  }
                }
LAB_001319bc:
                lVar21 = (long)iVar26;
                pvVar22 = (void *)((long)pvVar22 + lVar21 * cVar1);
                if (bVar30 || bVar8) {
                  lVar21 = 0;
                }
                local_68 = local_68 + lVar21;
                bVar10 = true;
              }
              else {
                if (uVar2 == 2) {
                  uVar2 = peVar7[uVar27].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar26) {
                      lVar21 = 0;
                      do {
                        *pfVar29 = *(float *)((long)pvVar22 + lVar21 * 4);
                        pfVar29 = (float *)((long)pfVar29 + lVar16);
                        lVar21 = lVar21 + 1;
                      } while (iVar26 != (int)lVar21);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar26) {
                      lVar21 = 0;
                      do {
                        uVar11 = *(uint *)((long)pvVar22 + lVar21 * 4);
                        uVar18 = uVar11 & 0x7fffffff;
                        uVar23 = (ushort)(uVar11 >> 0x10) & 0x8000;
                        if (uVar18 < 0x38800000) {
                          if ((0x33000000 < uVar18) &&
                             (uVar11 = uVar11 & 0x7fffff | 0x800000, cVar9 = (char)(uVar18 >> 0x17),
                             uVar23 = uVar23 | (ushort)(uVar11 >> (0x7eU - cVar9 & 0x1f)),
                             0x80000000 < uVar11 << (cVar9 + 0xa2U & 0x1f))) {
                            uVar23 = uVar23 + 1;
                          }
                        }
                        else if (uVar18 < 0x7f800000) {
                          if (uVar18 < 0x477ff000) {
                            uVar23 = (ushort)(uVar18 + 0x8000fff + (uint)((uVar18 >> 0xd & 1) != 0)
                                             >> 0xd) | uVar23;
                          }
                          else {
                            uVar23 = uVar23 | 0x7c00;
                          }
                        }
                        else {
                          uVar23 = uVar23 | 0x7c00;
                          if (uVar18 != 0x7f800000) {
                            uVar11 = uVar18 >> 0xd & 0x3ff;
                            uVar23 = uVar23 | (ushort)uVar11 | (ushort)(uVar11 == 0);
                          }
                        }
                        *(ushort *)pfVar29 = uVar23;
                        pfVar29 = (float *)((long)pfVar29 + lVar16);
                        lVar21 = lVar21 + 1;
                      } while (iVar26 != (int)lVar21);
                    }
                  }
                  else {
                    if (uVar2 != 0) goto LAB_001316fb;
                    if (0 < iVar26) {
                      lVar21 = 0;
                      do {
                        fVar19 = *(float *)((long)pvVar22 + lVar21 * 4);
                        fVar20 = 0.0;
                        if (0.0 <= fVar19) {
                          fVar20 = (float)(long)fVar19;
                          if (ABS(fVar19) == INFINITY) {
                            fVar20 = -NAN;
                          }
                          if (4.2949673e+09 < fVar19) {
                            fVar20 = -NAN;
                          }
                        }
                        *pfVar29 = fVar20;
                        pfVar29 = (float *)((long)pfVar29 + lVar16);
                        lVar21 = lVar21 + 1;
                      } while (iVar26 != (int)lVar21);
                    }
                  }
                  goto LAB_001319bc;
                }
                if (uVar2 == 1) {
                  uVar2 = peVar7[uVar27].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar26) {
                      lVar21 = 0;
                      do {
                        uVar18 = (uint)*(short *)((long)pvVar22 + lVar21 * 2);
                        uVar11 = uVar18 & 0x7fff;
                        uVar25 = uVar11 << 0xd;
                        fVar19 = (float)(uVar18 & 0x80000000);
                        if (uVar25 < 0x800000) {
                          if (uVar11 != 0) {
                            uVar18 = 0x1f;
                            if (uVar11 != 0) {
                              for (; uVar25 >> uVar18 == 0; uVar18 = uVar18 - 1) {
                              }
                            }
                            iVar14 = (uVar18 ^ 0x1f) - 8;
                            fVar19 = (float)(((uint)fVar19 | uVar25 << ((byte)iVar14 & 0x1f) |
                                             0x38800000) + iVar14 * -0x800000);
                          }
                        }
                        else if (uVar25 < 0xf800000) {
                          fVar19 = (float)(((uint)fVar19 | uVar25) + 0x38000000);
                        }
                        else {
                          fVar19 = (float)((uint)fVar19 | uVar25 | 0x7f800000);
                        }
                        *pfVar29 = fVar19;
                        pfVar29 = (float *)((long)pfVar29 + lVar16);
                        lVar21 = lVar21 + 1;
                      } while (iVar26 != (int)lVar21);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar26) {
                      lVar21 = 0;
                      do {
                        *(ushort *)pfVar29 = *(ushort *)((long)pvVar22 + lVar21 * 2);
                        pfVar29 = (float *)((long)pfVar29 + lVar16);
                        lVar21 = lVar21 + 1;
                      } while (iVar26 != (int)lVar21);
                    }
                  }
                  else {
                    if (uVar2 != 0) goto LAB_001316fb;
                    if (0 < iVar26) {
                      lVar21 = 0;
                      do {
                        uVar23 = *(ushort *)((long)pvVar22 + lVar21 * 2);
                        uVar11 = (uint)uVar23;
                        if ((short)uVar23 < 0) {
                          fVar19 = 0.0;
                        }
                        else if ((~uVar11 & 0x7c00) == 0) {
                          fVar19 = (float)-(uint)((uVar23 & 0x3ff) == 0);
                        }
                        else {
                          uVar18 = uVar11 * 0x2000;
                          if (uVar11 < 0x400) {
                            if (uVar23 == 0) {
                              fVar19 = 0.0;
                            }
                            else {
                              uVar25 = 0x1f;
                              if (uVar11 != 0) {
                                for (; uVar18 >> uVar25 == 0; uVar25 = uVar25 - 1) {
                                }
                              }
                              iVar14 = (uVar25 ^ 0x1f) - 8;
                              fVar19 = (float)((uVar18 << ((byte)iVar14 & 0x1f) | 0x38800000) +
                                              iVar14 * -0x800000);
                            }
                          }
                          else if (uVar11 < 0x7c00) {
                            fVar19 = (float)(uVar18 + 0x38000000);
                          }
                          else {
                            fVar19 = (float)(uVar18 | 0x7f800000);
                          }
                          fVar19 = (float)(long)fVar19;
                        }
                        *pfVar29 = fVar19;
                        pfVar29 = (float *)((long)pfVar29 + lVar16);
                        lVar21 = lVar21 + 1;
                      } while (iVar26 != (int)lVar21);
                    }
                  }
                  goto LAB_001319bc;
                }
LAB_001316fb:
                bVar10 = false;
              }
              if (!bVar10) {
                iVar12 = 1;
                goto LAB_00131a79;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar5);
            iVar12 = 0;
          }
LAB_00131a79:
          if ((iVar12 != 7) && (iVar12 != 0)) break;
          uVar13 = (ulong)decode->channel_count;
          bVar17 = (long)uVar28 < (long)uVar13;
          uVar27 = uVar28;
        } while ((long)uVar28 < (long)uVar13);
      }
      if (bVar17) {
        return 3;
      }
      piVar24 = piVar24 + (int)uVar5;
      iVar15 = iVar15 + 1;
    } while (iVar15 != iVar3 - iVar4);
  }
  return 0;
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height - decode->user_line_end_ignore;

    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = (y >= uls && ((c + 1) == decode->channel_count));

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];

                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }

            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += ((size_t) bpc) * ((size_t) samps);
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}